

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcrepo_value.cpp
# Opt level: O2

value_ptr __thiscall
pstore::dump::make_value
          (dump *this,shared_ptr<const_pstore::repo::compilation> *compilation,parameters *parm)

{
  element_type *peVar1;
  dump *members_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  definition *member;
  long lVar2;
  value_ptr vVar3;
  initializer_list<pstore::dump::object::member> __l;
  allocator_type local_14b;
  allocator local_14a;
  allocator local_149;
  dump *local_148;
  shared_ptr<const_pstore::repo::compilation> *local_140;
  value_ptr local_138;
  undefined1 local_128 [16];
  container members;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_100;
  string local_e8;
  string local_c8;
  indirect_string local_a8;
  member local_90 [2];
  
  members.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  members.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  members.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148 = this;
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::reserve(&members,(ulong)((compilation->
                             super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->size_);
  peVar1 = (compilation->
           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  member = peVar1->members_;
  local_140 = compilation;
  for (lVar2 = (ulong)peVar1->size_ * 0x30; lVar2 != 0; lVar2 = lVar2 + -0x30) {
    make_value((dump *)local_90,member,parm);
    std::
    vector<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
    ::emplace_back<std::shared_ptr<pstore::dump::value>>
              ((vector<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
                *)&members,(shared_ptr<pstore::dump::value> *)local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90[0].property._M_string_length)
    ;
    member = member + 1;
  }
  std::__cxx11::string::string((string *)&local_c8,"members",&local_149);
  make_value((container *)local_128);
  object::member::member(local_90,&local_c8,(value_ptr *)local_128);
  std::__cxx11::string::string((string *)&local_e8,"triple",&local_14a);
  indirect_string::read
            ((int)&local_a8,parm->db,
             (((local_140->
               super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->triple_).a_.a_);
  make_value((dump *)&local_138,&local_a8);
  object::member::member(local_90 + 1,&local_e8,&local_138);
  members_00 = local_148;
  __l._M_len = 2;
  __l._M_array = local_90;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_100,__l,&local_14b);
  make_value((container *)members_00);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_100);
  lVar2 = 0x30;
  do {
    object::member::~member((member *)((long)&local_90[0].property._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  std::__cxx11::string::~string((string *)&local_c8);
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector(&members);
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)members_00;
  return (value_ptr)vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (std::shared_ptr<repo::compilation const> const & compilation,
                              parameters const & parm) {
            array::container members;
            members.reserve (compilation->size ());
            for (auto const & member : *compilation) {
                members.emplace_back (make_value (member, parm));
            }

            using namespace serialize;
            using archive::make_reader;
            return make_value (object::container{
                {"members", make_value (members)},
                {"triple", make_value (indirect_string::read (parm.db, compilation->triple ()))},
            });
        }